

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O3

int command_input(int cmdidx,int rep,nh_cmd_arg *arg)

{
  bool bVar1;
  xchar x;
  xchar y;
  schar sVar2;
  schar sVar3;
  boolean bVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  _func_int *p_Var11;
  uint uVar12;
  int iVar13;
  char *pcVar14;
  boolean bVar15;
  char *__format;
  short sVar16;
  monst *mon;
  byte *__s;
  char *f;
  byte *pbVar17;
  byte *pbVar18;
  
  if (occupation == (_func_int *)0x0 || multi < 0) {
    if ((multi == 0) || (cmdidx != -1 && 0 < multi)) {
      bVar15 = '\x01';
      saved_cmd = cmdidx;
LAB_0013f39b:
      do_command(saved_cmd,rep,bVar15,arg);
    }
    else if (0 < multi) {
      if (rep == -1) {
        nomul(0,(char *)0x0);
        return 0;
      }
      if (flags.mv == '\0') {
        bVar15 = '\0';
        rep = multi;
        goto LAB_0013f39b;
      }
      if (((uint)multi < 0x50) && (multi = multi + -1, multi == 0)) {
        flags.run = 0;
        flags.mv = '\0';
        iflags.travel1 = '\0';
        flags.travel = '\0';
      }
      iVar6 = domove(u.dx,u.dy,'\0');
      if (iVar6 == 0) {
        flags.move = '\0';
        nomul(0,(char *)0x0);
      }
    }
  }
  else {
    iVar6 = (*occupation)();
    if (iVar6 == 0) {
      occupation = (_func_int *)0x0;
    }
    iVar6 = monster_nearby();
    if (iVar6 != 0) {
      stop_occupation();
      reset_eat();
    }
  }
  if (u.utotype == '\0') {
    if ((flags.move == '\0') || (flags.mv == '\0')) {
      iflags.botl = '\x01';
    }
  }
  else {
    deferred_goto();
  }
  if (vision_full_recalc != '\0') {
    vision_recalc(0);
  }
  if (multi != 0 && (iflags.runmode == 0 || flags.run == 0)) {
    if (flags.travel == '\0') {
      uVar12 = multi * -0x49249249 + 0x12492492;
    }
    else {
      uVar12 = moves * -0x49249249;
    }
    if (uVar12 < 0x24924925) {
      if (flags.run != 0) {
        iflags.botl = '\x01';
      }
      flush_screen();
    }
  }
  bVar15 = flags.move;
  if (flags.move == '\0') {
    bVar15 = '\0';
  }
  else {
    if (delay_start == 0) {
      delay_start = moves;
    }
    youmonst.movement = youmonst.movement + -0xc;
    iVar6 = 0;
    do {
      uVar12 = encumber_msg();
      calc_attr_bonus();
      validate_timers();
      validate_light_sources();
      flags.mon_moving = '\x01';
      do {
        iVar7 = movemon();
        if (0xc < youmonst.movement) break;
      } while ((char)iVar7 != '\0');
      flags.mon_moving = '\0';
      if (0xb < youmonst.movement || (char)iVar7 != '\0') goto LAB_0013fe0a;
      mcalcdistress();
      for (mon = level->monlist; mon != (monst *)0x0; mon = mon->nmon) {
        iVar7 = mcalcmove(mon);
        mon->movement = mon->movement + (short)iVar7;
      }
      uVar10 = 0x19;
      if ((u.uevent._1_1_ & 0x20) == 0) {
        sVar2 = depth(&u.uz);
        sVar3 = depth(&dungeon_topology.d_stronghold_level);
        uVar10 = 0x46;
        if (sVar3 < sVar2) {
          uVar10 = 0x32;
        }
      }
      uVar8 = mt_random();
      if (uVar8 % uVar10 == 0) {
        makemon((permonst *)0x0,level,0,0,0);
      }
      if ((u.usteed == (monst *)0x0) || (u.umoved == '\0')) {
        iVar7 = (int)(youmonst.data)->mmove;
        if ((u.uprops[0x1a].intrinsic & 0xf8ffffff) == 0 && u.uprops[0x1a].extrinsic == 0) {
          iVar9 = iVar7;
          if (u.uprops[0x1a].intrinsic != 0) {
            uVar10 = mt_random();
            iVar9 = iVar7 + 6;
            if (uVar10 * -0x55555555 < 0x55555556) {
              iVar9 = iVar7;
            }
          }
        }
        else {
          uVar10 = mt_random();
          iVar9 = iVar7 + 0xc;
          if (0x55555555 < uVar10 * -0x55555555) {
            iVar9 = iVar7 + 6;
          }
        }
      }
      else {
        iVar9 = mcalcmove(u.usteed);
      }
      switch(uVar12) {
      case 1:
        iVar7 = iVar9 + 3;
        if (-1 < iVar9) {
          iVar7 = iVar9;
        }
        iVar7 = iVar7 >> 2;
        break;
      case 2:
        iVar7 = iVar9 / 2;
        break;
      case 3:
        iVar13 = iVar9 * 3 + 3;
        if (-1 < iVar9 * 3) {
          iVar13 = iVar9 * 3;
        }
        iVar13 = iVar13 >> 2;
        goto LAB_0013f654;
      case 4:
        iVar7 = iVar9 * 7;
        iVar13 = iVar7 + 7;
        if (-1 < iVar7) {
          iVar13 = iVar7;
        }
        iVar13 = iVar13 >> 3;
LAB_0013f654:
        iVar9 = iVar9 - iVar13;
      default:
        goto switchD_0013f616_default;
      }
      iVar9 = iVar9 - iVar7;
switchD_0013f616_default:
      sVar16 = (short)iVar9 + youmonst.movement;
      youmonst.movement = 0;
      if (0 < sVar16) {
        youmonst.movement = sVar16;
      }
      settrack();
      moves = moves + 1;
      level->lastmoves = moves;
      if (flags.bypasses != '\0') {
        clear_bypasses();
      }
      if (u.uprops[0x29].intrinsic != 0) {
        glibr();
      }
      nh_timeout();
      run_regions(level);
      dgn_growths(level,'\x01','\x01');
      train_body_armor_skill();
      train_shield_skill();
      if (u.ublesscnt != 0) {
        u.ublesscnt = u.ublesscnt + -1;
      }
      iflags.botl = '\x01';
      if ((u._1052_1_ & 0x10) == 0) {
        if ((((u.umonnum == u.umonster) || ((youmonst.data)->mlet != '9')) ||
            (bVar4 = is_pool(level,(int)u.ux,(int)u.uy), bVar4 != '\0')) ||
           (bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar4 != '\0')) {
          if ((u.umonnum == u.umonster) || (u.mhmax <= u.mh)) {
            if ((u.uhp < u.uhpmax) &&
               (((u.uprops[10].extrinsic != 0 || u.uprops[10].intrinsic != 0) ||
                 (u.umoved == '\0' || (int)uVar12 < 2) ||
                (((youmonst.data)->mflags1 & 0x800000) != 0)))) {
              if ((u.ulevel < 10) || (0x55555555 < moves * -0x55555555)) {
                if (((u.uprops[10].intrinsic == 0 && u.uprops[10].extrinsic == 0) &&
                    (((youmonst.data)->mflags1 & 0x800000) == 0)) &&
                   ((9 < u.ulevel || (moves % ((int)(0x2a / (long)(u.ulevel + 2)) + 1U) != 0))))
                goto LAB_0013f962;
                u.uhp = u.uhp + 1;
                iVar9 = u.uhpmax;
                iVar7 = u.uhp;
              }
              else {
                bVar5 = acurr(4);
                iVar7 = 1;
                if ('\f' < (char)bVar5) {
                  uVar10 = mt_random();
                  iVar9 = uVar10 % (uint)bVar5 + 1;
                  iVar7 = u.ulevel + -9;
                  if (iVar9 < u.ulevel + -9) {
                    iVar7 = iVar9;
                  }
                }
                u.uhp = iVar7 + u.uhp;
                iVar9 = u.uhpmax;
                iVar7 = u.uhp;
                if (u.uhpmax <= u.uhp) {
                  iVar7 = u.uhpmax;
                  u.uhp = u.uhpmax;
                }
              }
LAB_0013f92f:
              iflags.botl = '\x01';
              interrupt_multi("Hit points",iVar7,iVar9);
            }
            goto LAB_0013f962;
          }
          if (u.mh < 1) goto LAB_0013f95d;
          if ((u.uprops[10].extrinsic != 0 || u.uprops[10].intrinsic != 0) ||
             (((youmonst.data)->mflags1 & 0x800000) != 0)) {
LAB_0013f7c8:
            u.mh = u.mh + 1;
            iVar9 = u.mhmax;
            iVar7 = u.mh;
            goto LAB_0013f92f;
          }
          if (1 < (int)uVar12) goto LAB_0013f962;
          if ((moves * -0x33333333 >> 2 | moves * 0x40000000) < 0xccccccd) goto LAB_0013f7c8;
LAB_0013fa3f:
          if (u.uenmax <= u.uen) goto LAB_0013fb3e;
          if ((int)uVar12 < 2) goto LAB_0013fa58;
        }
        else {
          if (u.mh < 2) {
            if (u.mh != 1) {
LAB_0013f95d:
              rehumanize();
            }
          }
          else {
            u.mh = u.mh + -1;
            iflags.botl = '\x01';
          }
LAB_0013f962:
          if (((int)uVar12 < 3) || (u.umoved == '\0')) goto LAB_0013fa3f;
          if (3 < uVar12) {
            if ((moves * -0x33333333 >> 1 | (uint)((moves * -0x33333333 & 1) != 0) << 0x1f) <
                0x1999999a) goto LAB_0013f9bf;
            goto LAB_0013fa3f;
          }
          if ((moves * -0x11111111 >> 1 | (uint)((moves * -0x11111111 & 1) != 0) << 0x1f) <
              0x8888889) {
LAB_0013f9bf:
            if (u.mh < 2 || u.umonnum == u.umonster) {
              if (u.uhp < 2 || u.umonnum != u.umonster) {
                pline("You pass out from exertion!");
                exercise(4,'\0');
                fall_asleep(-10,'\0');
              }
              else {
                u.uhp = u.uhp + -1;
              }
            }
            else {
              u.mh = u.mh + -1;
            }
            goto LAB_0013fa3f;
          }
          if (u.uenmax <= u.uen) goto LAB_0013fb3e;
        }
LAB_0013faa4:
        if ((u.uprops[0x30].intrinsic != 0) || (u.uprops[0x30].extrinsic != 0)) {
LAB_0013fabc:
          sVar2 = acurr(2);
          sVar3 = acurr(1);
          sVar16 = (short)((uint)(((int)sVar3 + (int)sVar2) * -0x7777) >> 0x10) +
                   (short)((int)sVar3 + (int)sVar2);
          uVar12 = mt_random();
          u.uen = SUB164(ZEXT416(uVar12) %
                         SEXT816((long)(short)(((sVar16 >> 3) - (sVar16 >> 0xf)) + 1)),0) + u.uen +
                  1;
          if (u.uenmax <= u.uen) {
            u.uen = u.uenmax;
          }
          iflags.botl = '\x01';
          interrupt_multi("Magic energy",u.uen,u.uenmax);
        }
      }
      else if (u.uen < u.uenmax) {
LAB_0013fa58:
        if (moves % (uint)((int)(((urole.malenum != 0x168) + 3) * (0x26 - u.ulevel)) / 6) != 0)
        goto LAB_0013faa4;
        goto LAB_0013fabc;
      }
LAB_0013fb3e:
      if ((u._1052_1_ & 0x10) == 0) {
        if ((((u.uprops[0xe].extrinsic != 0 || u.uprops[0xe].intrinsic != 0) ||
             (((youmonst.data)->mflags1 & 0x2000000) != 0)) &&
            (uVar12 = mt_random(), y = u.uy, x = u.ux, uVar12 * -0x3030303 < 0x3030304)) &&
           (((tele((char *)0x0), u.ux != x || (u.uy != y)) && (bVar4 = next_to_u(), bVar4 == '\0')))
           ) {
          check_leash(x,y);
        }
        if (((iVar6 == 1 && u.uprops[0x10].intrinsic == 0) && u.uprops[0x10].extrinsic == 0) ||
           ((iVar6 == 2 && (u.ulycn == -1)))) {
          iVar6 = 0;
        }
        if ((u.uprops[0x10].intrinsic == 0 && u.uprops[0x10].extrinsic == 0) ||
           (uVar12 = mt_random(), 0x28f5c28 < (uVar12 * -0x3d70a3d7 >> 2 | uVar12 * 0x40000000))) {
          if ((-1 < u.ulycn) && (u.umonnum == u.umonster)) {
            iVar7 = night();
            uVar12 = mt_random();
            if (SUB168(ZEXT416(uVar12) % SEXT816((long)(iVar7 * -0x14 + 0x50)),0) == 0) {
              iVar6 = 2;
            }
          }
        }
        else {
          iVar6 = 1;
        }
        if ((((iVar6 != 0) && (u.uprops[0x3d].intrinsic == 0)) && (u.uprops[0x3d].extrinsic == 0))
           && (-1 < multi)) {
          if (occupation == (_func_int *)0x0) {
            nomul(0,(char *)0x0);
          }
          else {
            stop_occupation();
          }
          if (iVar6 == 1) {
            iVar6 = 0;
            polyself('\0');
          }
          else {
            you_were();
            iVar6 = 0;
          }
        }
      }
      if ((u.uprops[0xb].extrinsic != 0 || u.uprops[0xb].intrinsic != 0) && (-1 < multi)) {
        dosearch0(1);
      }
      dosounds();
      do_storms();
      gethungry();
      age_spells();
      exerchk();
      invault();
      if ((u.uhave._0_1_ & 1) != 0) {
        amulet();
      }
      sVar2 = acurr(3);
      uVar12 = mt_random();
      if (SUB168(ZEXT416(uVar12) % SEXT816((long)sVar2 * 3 + 0x28),0) == 0) {
        uVar12 = mt_random();
        u_wipe_engr(uVar12 % 3 + 1);
      }
      if ((((u.uevent._1_1_ & 0x20) != 0) && ((u._1052_1_ & 0x10) == 0)) &&
         ((u.udg_cnt == 0 || (u.udg_cnt = u.udg_cnt - 1, u.udg_cnt == 0)))) {
        intervene();
        uVar12 = mt_random();
        u.udg_cnt = uVar12 % 200 + 0x32;
      }
      restore_attrib();
      bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level);
      if (bVar4 == '\0') {
        if ((u._1052_1_ & 2) == 0) {
          if ((u._1052_1_ & 0x20) != 0) {
            under_ground(0);
          }
        }
        else {
          under_water(0);
        }
      }
      else {
        movebubbles();
      }
      if (((multi < 0) && (multi = multi + 1, multi == 0)) &&
         (unmul((char *)0x0), u.utotype != '\0')) {
        deferred_goto();
      }
LAB_0013fe0a:
    } while (youmonst.movement < 0xc);
    if ((u.utrap != 0) && (u.utraptype == 3)) {
      bVar4 = is_lava(level,(int)u.ux,(int)u.uy);
      if (bVar4 == '\0') {
        u.utrap = 0;
      }
      else if ((u._1052_1_ & 0x10) == 0) {
        u.utrap = u.utrap - 0x100;
        if (u.utrap < 0x100) {
          killer_format = 1;
          killer = "molten lava";
          pline("You sink below the surface and die.");
          done(6);
        }
        else if (u.umoved == '\0') {
          Norep("You sink deeper into the lava.");
          uVar12 = mt_random();
          u.utrap = (uVar12 & 3) + u.utrap + 1;
        }
      }
    }
    iVar6 = prev_hp_notify;
    if ((iflags.hp_notify != '\0') && (iVar7 = uhp(), iVar6 != iVar7)) {
      pbVar17 = (byte *)"[HP%c%a=%h]";
      if (iflags.hp_notify_fmt != (char *)0x0) {
        pbVar17 = (byte *)iflags.hp_notify_fmt;
      }
      hp_notify_format_str_buf = 0;
      bVar5 = *pbVar17;
      if (bVar5 == 0) {
        __s = &hp_notify_format_str_buf;
      }
      else {
        bVar1 = false;
        pbVar18 = &hp_notify_format_str_buf;
        do {
          iVar6 = prev_hp_notify;
          __s = pbVar18;
          if (&DAT_003193f6 < pbVar18) {
            __s = &DAT_003193f6;
          }
          if (bVar1) {
            if (bVar5 < 99) {
              if (bVar5 == 0x48) {
                iVar6 = uhp();
                iVar7 = uhpmax();
                if (iVar6 == iVar7) {
                  __format = "%s";
                  pcVar14 = "max";
                }
                else {
                  iVar6 = uhp();
                  pcVar14 = (char *)(long)iVar6;
                  __format = "%ld";
                }
                snprintf((char *)__s,0x3193f7 - (long)__s,__format,pcVar14);
                if ((byte *)0x3193f5 < pbVar18) {
                  pbVar18 = &DAT_003193f6;
                }
                __s = pbVar18 + -1;
                do {
                  pbVar18 = __s + 1;
                  __s = __s + 1;
                } while (*pbVar18 != 0);
                goto LAB_001401af;
              }
              if (bVar5 != 0x61) goto LAB_001400a0;
              iVar6 = uhp();
              uVar10 = iVar6 - prev_hp_notify;
              uVar12 = -uVar10;
              if (0 < (int)uVar10) {
                uVar12 = uVar10;
              }
              snprintf((char *)__s,0x3193f7 - (long)__s,"%ld",(ulong)uVar12);
              if ((byte *)0x3193f5 < pbVar18) {
                pbVar18 = &DAT_003193f6;
              }
              __s = pbVar18 + -1;
              do {
                pbVar18 = __s + 1;
                __s = __s + 1;
              } while (*pbVar18 != 0);
            }
            else {
              if (bVar5 == 99) {
                iVar7 = uhp();
                bVar1 = false;
                snprintf((char *)__s,0x3193f7 - (long)__s,"%c",
                         (ulong)((uint)(iVar7 < iVar6) * 2 + 0x2b));
                __s = __s + 1;
                goto LAB_001401b1;
              }
              if (bVar5 == 0x68) {
                iVar6 = uhp();
                snprintf((char *)__s,0x3193f7 - (long)__s,"%ld",(long)iVar6);
                if ((byte *)0x3193f5 < pbVar18) {
                  pbVar18 = &DAT_003193f6;
                }
                __s = pbVar18 + -1;
                do {
                  pbVar18 = __s + 1;
                  __s = __s + 1;
                } while (*pbVar18 != 0);
                goto LAB_001401af;
              }
              if (bVar5 != 0x6d) goto LAB_001400a0;
              iVar6 = uhpmax();
              snprintf((char *)__s,0x3193f7 - (long)__s,"%ld",(long)iVar6);
              if ((byte *)0x3193f5 < pbVar18) {
                pbVar18 = &DAT_003193f6;
              }
              __s = pbVar18 + -1;
              do {
                pbVar18 = __s + 1;
                __s = __s + 1;
              } while (*pbVar18 != 0);
            }
            bVar1 = false;
          }
          else {
            bVar1 = true;
            if (bVar5 != 0x25) {
LAB_001400a0:
              *__s = bVar5;
              __s = __s + (__s < &DAT_003193f6);
LAB_001401af:
              bVar1 = false;
            }
          }
LAB_001401b1:
          bVar5 = pbVar17[1];
          pbVar17 = pbVar17 + 1;
          pbVar18 = __s;
        } while (bVar5 != 0);
      }
      *__s = 0;
      pline("%s",&hp_notify_format_str_buf);
      prev_hp_notify = uhp();
    }
  }
  xmalloc_cleanup();
  iflags.next_msg_nonblocking = '\0';
  flags.move = '\x01';
  pre_move_tasks(bVar15);
  p_Var11 = occupation;
  iVar6 = multi;
  if (flags.run == 0) {
    if ((delay_start == 0) || (multi != 0 || occupation != (_func_int *)0x0)) goto LAB_0014023d;
    if ((iflags.delay_msg == '\0') || (moves - delay_start < 2)) {
      p_Var11 = (_func_int *)0x0;
      iVar6 = 0;
    }
    else {
      pline("[%d turns]");
      p_Var11 = occupation;
      iVar6 = multi;
    }
  }
  delay_start = 0;
LAB_0014023d:
  if ((iVar6 == 0) && (p_Var11 == (_func_int *)0x0)) {
    flush_screen();
    maybe_tutorial();
  }
  return -1;
}

Assistant:

int command_input(int cmdidx, int rep, struct nh_cmd_arg *arg)
{
    boolean didmove = FALSE;
    
    if (multi >= 0 && occupation)
	handle_occupation();
    else if (multi == 0 || (multi > 0 && cmdidx != -1)) {
	saved_cmd = cmdidx;
	do_command(cmdidx, rep, TRUE, arg);
    } else if (multi > 0) {
	/* allow interruption of multi-turn commands */
	if (rep == -1) {
	    nomul(0, NULL);
	    return READY_FOR_INPUT;
	}
	
	if (flags.mv) {
	    if (multi < COLNO && !--multi)
		flags.travel = iflags.travel1 = flags.mv = flags.run = 0;
	    if (!domove(u.dx, u.dy, 0)) {
		/* Don't use a move when travelling into an obstacle. */
		flags.move = FALSE;
		nomul(0, NULL);
	    }
	} else
	    do_command(saved_cmd, multi, FALSE, arg);
    }
    /* no need to do anything here for multi < 0 */
    
    if (u.utotype)		/* change dungeon level */
	deferred_goto();	/* after rhack() */
    /* !flags.move here: multiple movement command stopped */
    else if (!flags.move || !flags.mv)
	iflags.botl = 1;

    if (vision_full_recalc)
	vision_recalc(0);	/* vision! */
    /* when running in non-tport mode, this gets done through domove() */
    if ((!flags.run || iflags.runmode == RUN_TPORT) &&
	    (multi && (!flags.travel ? !(multi % 7) : !(moves % 7L)))) {
	if (flags.run)
	    iflags.botl = 1;
	flush_screen();
    }
    
    didmove = flags.move;
    if (didmove) {
	you_moved();
    } /* actual time passed */

    /****************************************/
    /* once-per-player-input things go here */
    /****************************************/
    xmalloc_cleanup();
    iflags.next_msg_nonblocking = FALSE;

    /* prepare for the next move */
    flags.move = 1;
    pre_move_tasks(didmove);
    do_delay_msg();
    if (multi == 0 && !occupation) {
	flush_screen(); /* Flush screen buffer */
	maybe_tutorial();
    }
    
    return -1;
}